

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall parser::memo::any::of<hwl::Statement>::~of(of<hwl::Statement> *this)

{
  of<hwl::Statement> *in_RDI;
  
  ~of(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

of (const T& v) : v(v) {}